

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

void __thiscall
QArrayDataPointer<DomStringPropertySpecification_*>::relocate
          (QArrayDataPointer<DomStringPropertySpecification_*> *this,qsizetype offset,
          DomStringPropertySpecification ***data)

{
  DomStringPropertySpecification **d_first;
  DomStringPropertySpecification **ppDVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<DomStringPropertySpecification*,long_long>
            (this->ptr,this->size,d_first);
  if (data != (DomStringPropertySpecification ***)0x0) {
    ppDVar1 = *data;
    if ((this->ptr <= ppDVar1) && (ppDVar1 < this->ptr + this->size)) {
      *data = ppDVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }